

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O3

void add_huff_table(j_compress_ptr cinfo,JHUFF_TBL **htblptr,UINT8 *bits,UINT8 *val)

{
  undefined4 uVar1;
  jpeg_error_mgr *pjVar2;
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  ulong uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [13];
  JHUFF_TBL *pJVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  
  pJVar9 = *htblptr;
  if (pJVar9 == (JHUFF_TBL *)0x0) {
    pJVar9 = jpeg_alloc_huff_table((j_common_ptr)cinfo);
    *htblptr = pJVar9;
  }
  pJVar9->bits[0x10] = bits[0x10];
  uVar7 = *(undefined8 *)(bits + 8);
  *(undefined8 *)pJVar9->bits = *(undefined8 *)bits;
  *(undefined8 *)(pJVar9->bits + 8) = uVar7;
  lVar10 = 0;
  iVar11 = 0;
  iVar13 = 0;
  iVar14 = 0;
  iVar15 = 0;
  do {
    uVar1 = *(undefined4 *)(bits + lVar10 + 1);
    uVar6 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
    auVar3._8_4_ = 0;
    auVar3._0_8_ = uVar6;
    auVar3[0xc] = (char)((uint)uVar1 >> 0x18);
    auVar4[8] = (char)((uint)uVar1 >> 0x10);
    auVar4._0_8_ = uVar6;
    auVar4[9] = 0;
    auVar4._10_3_ = auVar3._10_3_;
    auVar8._5_8_ = 0;
    auVar8._0_5_ = auVar4._8_5_;
    auVar5[4] = (char)((uint)uVar1 >> 8);
    auVar5._0_4_ = (int)uVar6;
    auVar5[5] = 0;
    auVar5._6_7_ = SUB137(auVar8 << 0x40,6);
    iVar11 = iVar11 + (int)uVar6;
    iVar13 = iVar13 + auVar5._4_4_;
    iVar14 = iVar14 + auVar4._8_4_;
    iVar15 = iVar15 + (uint)(uint3)(auVar3._10_3_ >> 0x10);
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x10);
  uVar12 = iVar15 + iVar13 + iVar14 + iVar11;
  if (uVar12 - 0x101 < 0xffffff00) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 9;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  memcpy((*htblptr)->huffval,val,(ulong)uVar12);
  (*htblptr)->sent_table = 0;
  return;
}

Assistant:

LOCAL(void)
add_huff_table (j_compress_ptr cinfo,
		JHUFF_TBL **htblptr, const UINT8 *bits, const UINT8 *val)
/* Define a Huffman table */
{
  int nsymbols, len;

  if (*htblptr == NULL)
    *htblptr = jpeg_alloc_huff_table((j_common_ptr) cinfo);

  /* Copy the number-of-symbols-of-each-code-length counts */
  MEMCOPY((*htblptr)->bits, bits, SIZEOF((*htblptr)->bits));

  /* Validate the counts.  We do this here mainly so we can copy the right
   * number of symbols from the val[] array, without risking marching off
   * the end of memory.  jchuff.c will do a more thorough test later.
   */
  nsymbols = 0;
  for (len = 1; len <= 16; len++)
    nsymbols += bits[len];
  if (nsymbols < 1 || nsymbols > 256)
    ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);

  MEMCOPY((*htblptr)->huffval, val, nsymbols * SIZEOF(UINT8));

  /* Initialize sent_table FALSE so table will be written to JPEG file. */
  (*htblptr)->sent_table = FALSE;
}